

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BristolCircuit.cpp
# Opt level: O3

bool __thiscall
Circuit::base_circuit
          (Circuit *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *inputs,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *outputs)

{
  GateType GVar1;
  uint *puVar2;
  ulong uVar3;
  runtime_error *this_00;
  int iVar4;
  uint *puVar5;
  long lVar6;
  pointer puVar7;
  byte bVar8;
  pointer pGVar9;
  long lVar10;
  pointer puVar11;
  uint uVar12;
  uint uVar13;
  vector<unsigned_char,_std::allocator<unsigned_char>_> W;
  allocator_type local_31;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_30,(ulong)this->nWires,&local_31);
  if (this->nWires != 0) {
    uVar3 = 0;
    do {
      local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[uVar3] = 0xff;
      uVar3 = uVar3 + 1;
    } while (uVar3 < this->nWires);
  }
  puVar7 = (this->numI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar11 = (this->numI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (puVar11 != puVar7) {
    uVar3 = 0;
    iVar4 = 0;
    do {
      if (puVar7[uVar3] != 0) {
        uVar12 = 0;
        do {
          local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[iVar4 + uVar12] =
               (inputs->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start[iVar4 + uVar12];
          uVar12 = uVar12 + 1;
          puVar7 = (this->numI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        } while (uVar12 < puVar7[uVar3]);
        puVar11 = (this->numI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        iVar4 = iVar4 + uVar12;
      }
      uVar3 = (ulong)((int)uVar3 + 1);
    } while (uVar3 < (ulong)((long)puVar11 - (long)puVar7 >> 2));
  }
  pGVar9 = (this->GateT).super__Vector_base<GateType,_std::allocator<GateType>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->GateT).super__Vector_base<GateType,_std::allocator<GateType>_>._M_impl.
      super__Vector_impl_data._M_finish != pGVar9) {
    uVar12 = 1;
    uVar3 = 0;
    do {
      GVar1 = pGVar9[uVar3];
      if (GVar1 == INV) {
        bVar8 = local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start
                [*(this->GateI).
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar3].
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start] ^ 1;
        puVar5 = (this->GateO).
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar3].
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
LAB_0010559a:
        local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[*puVar5] = bVar8;
      }
      else if (GVar1 == EQ) {
        local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start
        [*(this->GateO).
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar3].
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start] =
             **(uchar **)
               &(this->GateI).
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar3].
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data;
      }
      else {
        if (GVar1 != EQW) {
          puVar5 = (this->GateO).
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar3].
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (GVar1 == XOR) {
            puVar2 = (this->GateI).
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar3].
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            bVar8 = local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start[puVar2[1]] ^
                    local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start[*puVar2];
          }
          else {
            if (GVar1 != AND) {
              if (GVar1 == MAND) {
                this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(this_00,"MAND not supported");
              }
              else {
                this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(this_00,"not_implemented");
              }
              __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            puVar2 = (this->GateI).
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar3].
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            bVar8 = local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start[puVar2[1]] &
                    local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start[*puVar2];
          }
          goto LAB_0010559a;
        }
        local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start
        [*(this->GateO).
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar3].
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start] =
             local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start
             [*(this->GateI).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar3].
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start];
      }
      uVar3 = (ulong)uVar12;
      pGVar9 = (this->GateT).super__Vector_base<GateType,_std::allocator<GateType>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar12 = uVar12 + 1;
    } while (uVar3 < (ulong)((long)(this->GateT).
                                   super__Vector_base<GateType,_std::allocator<GateType>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)pGVar9 >> 2));
  }
  puVar7 = (this->numO).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = 0;
  lVar6 = (long)(this->numO).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_finish - (long)puVar7;
  if (lVar6 != 0) {
    lVar6 = lVar6 >> 2;
    lVar10 = 0;
    do {
      uVar12 = (int)uVar3 + puVar7[lVar10];
      uVar3 = (ulong)uVar12;
      lVar10 = lVar10 + 1;
    } while (lVar6 + (ulong)(lVar6 == 0) != lVar10);
    uVar3 = (ulong)uVar12;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(outputs,uVar3);
  puVar7 = (this->numO).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar11 = (this->numO).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if ((long)puVar11 - (long)puVar7 != 0) {
    uVar12 = this->nWires;
    uVar3 = 0;
    do {
      uVar12 = uVar12 - puVar7[uVar3];
      uVar3 = uVar3 + 1;
    } while ((uVar3 & 0xffffffff) < (ulong)((long)puVar11 - (long)puVar7 >> 2));
    if (puVar11 != puVar7) {
      uVar3 = 0;
      iVar4 = 0;
      do {
        if (puVar7[uVar3] != 0) {
          uVar13 = 0;
          do {
            (outputs->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_start[iVar4 + uVar13] =
                 local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar12 + uVar13];
            uVar13 = uVar13 + 1;
            puVar7 = (this->numO).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          } while (uVar13 < puVar7[uVar3]);
          puVar11 = (this->numO).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          iVar4 = iVar4 + uVar13;
          uVar12 = uVar12 + uVar13;
        }
        uVar3 = (ulong)((int)uVar3 + 1);
      } while (uVar3 < (ulong)((long)puVar11 - (long)puVar7 >> 2));
    }
  }
  if (local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return true;
}

Assistant:

bool Circuit::base_circuit(const vector<uint8_t> &inputs,
                           vector<uint8_t> &outputs) const {
  vector<uint8_t> W(nWires);
  for (unsigned int i = 0; i < nWires; i++) {
    W[i] = -1;
  }

  // Load inputs
  unsigned int cnt = 0;
  for (unsigned int i = 0; i < numI.size(); i++) {
    for (unsigned int j = 0; j < numI[i]; j++) {
      W[cnt] = inputs[cnt];
      cnt++;
    }
  }

  // Evaluate the circuit
  for (unsigned int i = 0; i < GateT.size();
       i++) { // First check if ordering is broken
    if (GateT[i] != EQ && W[GateI[i][0]] < 0) {
      throw std::runtime_error("Circuit error");
    }
    if (GateT[i] != INV && GateT[i] != EQ && GateT[i] != EQW) {
      for (unsigned int j = 1; j < GateO[i].size(); j++) {
        if (W[GateI[i][j]] < 0) {
          throw std::runtime_error("Circuit error");
        }
      }
    }
    // Now evaluate the gate
    if (GateT[i] == AND) {
      W[GateO[i][0]] = W[GateI[i][0]] & W[GateI[i][1]];
    } else if (GateT[i] == MAND) {

      throw std::runtime_error("MAND not supported");
      // for (unsigned int j= 0; j < GateO[i].size(); j++)
      //  {
      //    W[GateO[i][j]]= W[GateI[i][j]] & W[GateI[i][j + GateO[i].size()]];
      //  }
    } else if (GateT[i] == XOR) {
      W[GateO[i][0]] = W[GateI[i][0]] ^ W[GateI[i][1]];
    } else if (GateT[i] == EQ) {
      W[GateO[i][0]] = GateI[i][0];
    } else if (GateT[i] == EQW) {
      W[GateO[i][0]] = W[GateI[i][0]];
    } else if (GateT[i] == INV) {
      W[GateO[i][0]] = 1 ^ W[GateI[i][0]];
    } else {
      throw std::runtime_error("not_implemented");
    }
  }

  // Now produce the output
  outputs.resize(total_num_out());
  cnt = nWires;
  unsigned int cntOut = 0;
  for (unsigned int i = 0; i < numO.size(); i++) {
    cnt -= numO[i];
  }
  for (unsigned int i = 0; i < numO.size(); i++) {
    // outputs[i].resize(numO[i]);
    for (unsigned int j = 0; j < numO[i]; j++) {
      outputs[cntOut] = W[cnt];
      cnt++;
      cntOut++;
    }
  }
  return true;
}